

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O1

const_reference __thiscall
duckdb::vector<duckdb::ColumnSegmentInfo,_true>::operator[]
          (vector<duckdb::ColumnSegmentInfo,_true> *this,size_type __n)

{
  pointer pCVar1;
  InternalException *this_00;
  ulong params_1;
  string local_48;
  
  pCVar1 = (this->
           super_vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>).
           super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  params_1 = ((long)(this->
                    super_vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>
                    ).
                    super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) *
             -0x1084210842108421;
  if (__n <= params_1 && params_1 - __n != 0) {
    return pCVar1 + __n;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Attempted to access index %ld within vector of size %ld","");
  InternalException::InternalException<unsigned_long,unsigned_long>(this_00,&local_48,__n,params_1);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

typename original::const_reference operator[](typename original::size_type __n) const { // NOLINT: hiding on purpose
		return get<SAFE>(__n);
	}